

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O0

void __thiscall
ft::treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::treeBase
          (treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *this,
          treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *other)

{
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *local_18;
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *other_local;
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *this_local;
  
  this->_vptr_treeBase = (_func_int **)&PTR__treeBase_0011dc60;
  local_18 = other;
  other_local = this;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_>::RBTree(&this->m_tree);
  this->m_size = 0;
  get_allocator((treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)
                &stack0xffffffffffffffe7);
  allocator<ft::treeNode<int>_>::allocator<int>
            ((allocator<ft::treeNode<int>_> *)&this->field_0x39,
             (allocator<int> *)&stack0xffffffffffffffe7);
  allocator<int>::~allocator((allocator<int> *)&stack0xffffffffffffffe7);
  treeInit(this);
  return;
}

Assistant:

treeBase(treeBase const & other):
	m_tree(rbtree()),
	m_size(0),
	m_comp(other.m_comp),
	m_alloc(other.get_allocator()) {
		this->treeInit();
	}